

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O1

void printHelp(int *param_1,char ***argv,string *fileExt)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
  __s = **argv;
  if (__s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x2162f0);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [options] ",0xb);
  if (fileExt->_M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"<file>.",7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,(fileExt->_M_dataplus)._M_p,fileExt->_M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Options:\n",9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "  -h, --help\n     Print help for common options.\n  --help-all\n     Print help for all options.\n  -a\n     Satisfaction problems: Find and print all solutions.\n     Optimisation problems: Print all (sub-optimal) intermediate solutions.\n  -n <n>, --n-of-solutions <n>\n     An upper bound on the number of solutions (default "
             ,0x141);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,").\n  -v, --verbose\n     Verbose mode (default ",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"off",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,").\n  -t, --time-out <n>\n     Time out in milliseconds (default ",0x3f);
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,", 0 = run indefinitely).\n  --rnd-seed <n>\n     Set random seed (default ",
             0x48);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "). If 0 then the current time\n     via std::time(0) is used.\n\nSearch Options:\n  -f [on|off]\n     Free search. Alternates between user-specified and activity-based\n     search when search is restarted. Restart base is set to 100.\n\nProfiler Options:\n  -cpprofiler id,port\n     Send search to CP Profiler with the given execution ID and port.\n\n"
             ,0x155);
  return;
}

Assistant:

void printHelp(int& /*argc*/, char**& argv, const std::string& fileExt) {
	const Options def;
	std::cout << "Usage: " << argv[0] << " [options] ";
	if (!fileExt.empty()) {
		std::cout << "<file>." << fileExt;
	}
	std::cout << "\n";
	std::cout << "Options:\n";
	std::cout << "  -h, --help\n"
							 "     Print help for common options.\n"
							 "  --help-all\n"
							 "     Print help for all options.\n"
							 "  -a\n"
							 "     Satisfaction problems: Find and print all solutions.\n"
							 "     Optimisation problems: Print all (sub-optimal) intermediate solutions.\n"
							 "  -n <n>, --n-of-solutions <n>\n"
							 "     An upper bound on the number of solutions (default "
						<< def.nof_solutions
						<< ").\n"
							 "  -v, --verbose\n"
							 "     Verbose mode (default "
						<< (def.verbosity == 0 ? "off" : "on")
						<< ").\n"
							 "  -t, --time-out <n>\n"
							 "     Time out in milliseconds (default "
						<< def.time_out.count()
						<< ", 0 = run indefinitely).\n"
							 "  --rnd-seed <n>\n"
							 "     Set random seed (default "
						<< def.rnd_seed
						<< "). If 0 then the current time\n"
							 "     via std::time(0) is used.\n"
							 "\n"
							 "Search Options:\n"
							 "  -f [on|off]\n"
							 "     Free search. Alternates between user-specified and activity-based\n"
							 "     search when search is restarted. Restart base is set to 100.\n"
#ifdef HAS_PROFILER
							 "\n"
							 "Profiler Options:\n"
							 "  -cpprofiler id,port\n"
							 "     Send search to CP Profiler with the given execution ID and port.\n"
#endif
							 "\n";
}